

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void __thiscall
RecursionState::
RecursionState<WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>>
          (RecursionState *this,
          WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float> *workspace,
          bool full_state)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  type pdVar8;
  double *pdVar9;
  byte in_DL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  undefined8 *in_RDI;
  size_t ix_1;
  size_t ix;
  size_t tot;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  unique_ptr<double[],_std::default_delete<double[]>_> *in_stack_ffffffffffffff20;
  pointer *ppuVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  ulong local_88;
  ulong local_80;
  allocator_type local_61;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x5eff1d);
  __last._M_current = in_RDI + 0xb;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x5eff30);
  __first._M_current = in_RDI + 0x10;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5eff46);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<std::default_delete<double[]>,void>(in_stack_ffffffffffffff20);
  *(byte *)((long)in_RDI + 0x39) = in_DL & 1;
  in_RDI[3] = in_RSI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  in_RDI[4] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  bVar3 = ColumnSampler<long_double>::has_weights((ColumnSampler<long_double> *)0x5effa2);
  if (bVar3) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_RDI[6] = in_RSI[0x13].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    in_RDI[5] = in_RSI[0x11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if ((*(byte *)((long)in_RDI + 0x39) & 1) != 0) {
    *in_RDI = in_RSI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    in_RDI[1] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    in_RDI[2] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    *(byte *)(in_RDI + 7) =
         *(byte *)&in_RSI[9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage & 1;
    bVar3 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff30);
    if ((bVar3) &&
       (in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish <
        in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)) {
      local_50 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_ffffffffffffff28,(difference_type)in_stack_ffffffffffffff20);
      local_60 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_ffffffffffffff18);
      local_58 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_ffffffffffffff28,(difference_type)in_stack_ffffffffffffff20
                            );
      __a = &local_61;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x5f0122);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (this_00,__first,__last,__a);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30)
      ;
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x5f0176);
      if ((*(byte *)(in_RDI + 7) & 1) != 0) {
        uVar4 = (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        operator_new__(uVar5);
        std::unique_ptr<double[],std::default_delete<double[]>>::
        unique_ptr<double*,std::default_delete<double[]>,void,bool>
                  (in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
        std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
                  (in_stack_ffffffffffffff20,
                   (unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_ffffffffffffff18
                  );
        std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                  (in_stack_ffffffffffffff20);
        bVar3 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff30);
        if (bVar3) {
          for (local_88 = 0; local_88 < uVar4; local_88 = local_88 + 1) {
            ppuVar10 = &in_RSI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_RSI,local_88 +
                              (long)in_RSI[4].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
            pdVar9 = tsl::
                     robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                   *)ppuVar10,(unsigned_long *)in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff18 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pdVar9;
            pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                               ((unique_ptr<double[],_std::default_delete<double[]>_> *)ppuVar10,
                                (size_t)in_stack_ffffffffffffff18);
            *pdVar8 = (double)in_stack_ffffffffffffff18;
          }
        }
        else {
          for (local_80 = 0; local_80 < uVar4; local_80 = local_80 + 1) {
            ppuVar10 = &in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in_RSI,local_80 +
                                       (long)in_RSI[4].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)ppuVar10,*pvVar6);
            vVar1 = *pvVar7;
            pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                               (in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
            *pdVar8 = vVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

RecursionState::RecursionState(WorkerMemory &workspace, bool full_state)
{
    this->full_state = full_state;

    this->split_ix         =  workspace.split_ix;
    this->end              =  workspace.end;
    if (!workspace.col_sampler.has_weights())
        this->sampler_pos  =  workspace.col_sampler.curr_pos;
    else {
        this->col_sampler_weights = workspace.col_sampler.tree_weights;
        this->n_dropped           = workspace.col_sampler.n_dropped;
    }

    if (this->full_state)
    {
        this->st           = workspace.st;
        this->st_NA        = workspace.st_NA;
        this->end_NA       = workspace.end_NA;

        this->changed_weights = workspace.changed_weights;

        /* for the extended model, it's not necessary to copy everything */
        if (workspace.comb_val.empty() && workspace.st_NA < workspace.end_NA)
        {
            this->ix_arr = std::vector<size_t>(workspace.ix_arr.begin() + workspace.st_NA,
                                               workspace.ix_arr.begin() + workspace.end_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                this->weights_arr = std::unique_ptr<double[]>(new double[tot]);
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]];
            }
        }
    }
}